

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynShortFunctionDefinition * ParseShortFunctionDefinition(ParseContext *ctx)

{
  Lexeme *begin;
  SynBase *pSVar1;
  bool bVar2;
  int iVar3;
  SynIdentifier *this;
  Lexeme *pLVar4;
  Lexeme *end;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SynBase *pSVar5;
  undefined4 extraout_var_02;
  Lexeme *pLVar6;
  char *msg;
  InplaceStr name;
  IntrusiveList<SynBase> local_88;
  SynShortFunctionArgument *local_78;
  SynShortFunctionArgument *pSStack_70;
  IntrusiveList<SynShortFunctionArgument> arguments;
  SynShortFunctionDefinition *this_00;
  undefined4 extraout_var;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_less) {
    pLVar6 = begin + 1;
    ctx->currentLexeme = pLVar6;
    arguments.head = (SynShortFunctionArgument *)0x0;
    arguments.tail = (SynShortFunctionArgument *)0x0;
    if (begin[1].type != lex_greater) {
      while( true ) {
        local_78 = (SynShortFunctionArgument *)ParseType(ctx,(bool *)0x0,false);
        if (ctx->currentLexeme->type != lex_string) {
          ctx->currentLexeme = pLVar6;
          local_78 = (SynShortFunctionArgument *)0x0;
        }
        if (arguments.head == (SynShortFunctionArgument *)0x0) {
          msg = "ERROR: function argument name not found after \'<\'";
        }
        else {
          msg = "ERROR: function argument name not found after \',\'";
        }
        bVar2 = anon_unknown.dwarf_153727::CheckAt(ctx,lex_string,msg);
        if (bVar2) {
          name = ParseContext::Consume(ctx);
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          this = (SynIdentifier *)CONCAT44(extraout_var,iVar3);
          pLVar4 = ParseContext::Previous(ctx);
          end = ParseContext::Previous(ctx);
          SynIdentifier::SynIdentifier(this,pLVar4,end,name);
        }
        else {
          pLVar6 = ParseContext::Previous(ctx);
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
          this = (SynIdentifier *)CONCAT44(extraout_var_00,iVar3);
          SynIdentifier::SynIdentifier(this,(InplaceStr)ZEXT816(0));
        }
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pLVar4 = ParseContext::Previous(ctx);
        SynShortFunctionArgument::SynShortFunctionArgument
                  ((SynShortFunctionArgument *)CONCAT44(extraout_var_01,iVar3),pLVar6,pLVar4,
                   &local_78->super_SynBase,this);
        IntrusiveList<SynShortFunctionArgument>::push_back
                  (&arguments,(SynShortFunctionArgument *)CONCAT44(extraout_var_01,iVar3));
        if (ctx->currentLexeme->type != lex_comma) break;
        pLVar6 = ctx->currentLexeme + 1;
        ctx->currentLexeme = pLVar6;
      }
    }
    anon_unknown.dwarf_153727::CheckConsume
              (ctx,lex_greater,"ERROR: \'>\' expected after short inline function argument list");
    local_88 = (IntrusiveList<SynBase>)ZEXT816(0);
    if (ctx->currentLexeme->type == lex_ofigure) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      local_88 = ParseExpressions(ctx);
      anon_unknown.dwarf_153727::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after function body");
    }
    else {
      pSVar5 = ParseStatement(ctx);
      if ((pSVar5 == (SynBase *)0x0) && (pSVar5 = ParseAssignment(ctx), pSVar5 == (SynBase *)0x0)) {
        anon_unknown.dwarf_153727::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after function header");
      }
      else {
        IntrusiveList<SynBase>::push_back(&local_88,pSVar5);
      }
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this_00 = (SynShortFunctionDefinition *)CONCAT44(extraout_var_02,iVar3);
    pLVar6 = ParseContext::Previous(ctx);
    pSVar5 = local_88.head;
    pSVar1 = local_88.tail;
    local_78 = arguments.head;
    pSStack_70 = arguments.tail;
    SynBase::SynBase((SynBase *)this_00,0x39,begin,pLVar6);
    (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e5180;
    (this_00->arguments).head = local_78;
    (this_00->arguments).tail = pSStack_70;
    (this_00->expressions).head = pSVar5;
    (this_00->expressions).tail = pSVar1;
  }
  else {
    this_00 = (SynShortFunctionDefinition *)0x0;
  }
  return this_00;
}

Assistant:

SynShortFunctionDefinition* ParseShortFunctionDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_less))
	{
		IntrusiveList<SynShortFunctionArgument> arguments;

		bool isFirst = true;

		do
		{
			if(isFirst && ctx.At(lex_greater))
				break;

			isFirst = false;

			Lexeme *pos = ctx.currentLexeme;

			Lexeme *lexeme = ctx.currentLexeme;

			SynBase *type = ParseType(ctx);

			if(!ctx.At(lex_string))
			{
				// Backtrack
				ctx.currentLexeme = lexeme;

				type = NULL;
			}

			bool hasName = false;

			if(arguments.empty())
				hasName = CheckAt(ctx, lex_string, "ERROR: function argument name not found after '<'");
			else
				hasName = CheckAt(ctx, lex_string, "ERROR: function argument name not found after ','");

			SynIdentifier *nameIdentifier = NULL;

			if(hasName)
			{
				InplaceStr name = ctx.Consume();
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else
			{
				pos = ctx.Previous();

				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
			}

			arguments.push_back(new (ctx.get<SynShortFunctionArgument>()) SynShortFunctionArgument(pos, ctx.Previous(), type, nameIdentifier));
		}
		while(ctx.Consume(lex_comma));

		CheckConsume(ctx, lex_greater, "ERROR: '>' expected after short inline function argument list");

		IntrusiveList<SynBase> expressions;

		if(ctx.Consume(lex_ofigure))
		{
			expressions = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after function body");
		}
		else if(SynBase *body = ParseStatement(ctx))
		{
			expressions.push_back(body);
		}
		else if(SynBase *body = ParseAssignment(ctx))
		{
			expressions.push_back(body);
		}
		else
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after function header");
		}

		return new (ctx.get<SynShortFunctionDefinition>()) SynShortFunctionDefinition(start, ctx.Previous(), arguments, expressions);
	}

	return NULL;
}